

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O3

value_type * __thiscall
poplar::
map<poplar::compact_bonsai_trie<85U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
::update(map<poplar::compact_bonsai_trie<85U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
         *this,char_range key)

{
  compact_bonsai_trie<85U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
  *this_00;
  uint32_t uVar1;
  bool bVar2;
  value_type *pvVar3;
  undefined8 *puVar4;
  byte bVar5;
  char *pcVar6;
  uint32_t uVar7;
  ulong uVar8;
  uint64_t pos;
  pair<const_int_*,_unsigned_long> pVar9;
  uint64_t node_id;
  char_range local_2e8;
  map<poplar::compact_bonsai_trie<85U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>,_poplar::compact_bonsai_nlm<int,_16UL>_>
  local_2d8;
  
  local_2e8.end = key.end;
  local_2e8.begin = key.begin;
  if (local_2e8.begin == local_2e8.end) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar4 = &PTR__exception_0016cab0;
    pcVar6 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:122:key must be a non-empty string."
    ;
  }
  else {
    if (local_2e8.end[-1] == 0) {
      this_00 = &this->hash_trie_;
      if ((this->hash_trie_).size_ == 0) {
        if (this->is_ready_ == false) {
          map(&local_2d8,0,0x20);
          this->is_ready_ = local_2d8.is_ready_;
          *(undefined7 *)&this->field_0x1 = local_2d8._1_7_;
          this->lambda_ = local_2d8.lambda_;
          compact_bonsai_trie<85U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
          ::operator=(this_00,&local_2d8.hash_trie_);
          compact_bonsai_nlm<int,_16UL>::operator=(&this->label_store_,&local_2d8.label_store_);
          memcpy(&this->codes_,&local_2d8.codes_,0x110);
          compact_bonsai_nlm<int,_16UL>::~compact_bonsai_nlm(&local_2d8.label_store_);
          compact_bonsai_trie<85U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
          ::~compact_bonsai_trie(&local_2d8.hash_trie_);
        }
        this->size_ = this->size_ + 1;
        (this->hash_trie_).size_ = 1;
        pos = 0;
LAB_00154e4a:
        pvVar3 = compact_bonsai_nlm<int,_16UL>::insert(&this->label_store_,pos,&local_2e8);
      }
      else {
        local_2d8._0_8_ = 0;
        do {
          pVar9 = compact_bonsai_nlm<int,_16UL>::compare
                            (&this->label_store_,local_2d8._0_8_,&local_2e8);
          uVar8 = pVar9.second;
          if (pVar9.first != (value_type *)0x0) {
            return pVar9.first;
          }
          local_2e8.begin = local_2e8.begin + uVar8;
          if (this->lambda_ <= uVar8) {
            do {
              bVar2 = compact_bonsai_trie<85U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                      ::add_child(this_00,(uint64_t *)&local_2d8,0xff);
              if (bVar2) {
                expand_if_needed_(this,(uint64_t *)&local_2d8);
              }
              uVar8 = uVar8 - this->lambda_;
            } while (this->lambda_ <= uVar8);
          }
          bVar5 = (this->codes_)._M_elems[*local_2e8.begin];
          if (bVar5 == 0xff) {
            uVar1 = this->num_codes_;
            uVar7 = uVar1 + 1;
            this->num_codes_ = uVar7;
            (this->codes_)._M_elems[*local_2e8.begin] = (uchar)uVar1;
            if (uVar7 == 0xff) {
              puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
              *puVar4 = &PTR__exception_0016cab0;
              pcVar6 = 
              "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:171:"
              ;
              goto LAB_00154eb6;
            }
            bVar5 = (this->codes_)._M_elems[*local_2e8.begin];
          }
          bVar2 = compact_bonsai_trie<85U,_5U,_poplar::compact_hash_table<7U,_80U,_poplar::bijective_hash::split_mix_hasher>,_poplar::standard_hash_table<80U,_poplar::hash::vigna_hasher>,_poplar::bijective_hash::split_mix_hasher>
                  ::add_child(this_00,(uint64_t *)&local_2d8,uVar8 << 8 | (ulong)bVar5);
          if (bVar2) {
            expand_if_needed_(this,(uint64_t *)&local_2d8);
            local_2e8.begin = local_2e8.begin + 1;
            this->size_ = this->size_ + 1;
            pos = local_2d8._0_8_;
            goto LAB_00154e4a;
          }
          local_2e8.begin = local_2e8.begin + 1;
        } while (local_2e8.begin != local_2e8.end);
        pVar9 = compact_bonsai_nlm<int,_16UL>::compare
                          (&this->label_store_,local_2d8._0_8_,&local_2e8);
        pvVar3 = pVar9.first;
      }
      return pvVar3;
    }
    puVar4 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar4 = &PTR__exception_0016cab0;
    pcVar6 = 
    "/workspace/llm4binary/github/license_c_cmakelists/kampersanda[P]poplar-trie/include/poplar/map.hpp:123:The last character of key must be the null terminator."
    ;
  }
LAB_00154eb6:
  puVar4[1] = pcVar6;
  __cxa_throw(puVar4,&exception::typeinfo,std::exception::~exception);
}

Assistant:

value_type* update(char_range key) {
        POPLAR_THROW_IF(key.empty(), "key must be a non-empty string.");
        POPLAR_THROW_IF(*(key.end - 1) != '\0', "The last character of key must be the null terminator.");

        if (hash_trie_.size() == 0) {
            if (!is_ready_) {
                *this = this_type{0};
            }
            // The first insertion
            ++size_;
            hash_trie_.add_root();

            if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                // assert(hash_trie_.get_root() == label_store_.size());
                return label_store_.append(key);
            }
            if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                return label_store_.insert(hash_trie_.get_root(), key);
            }
            // should not come
            assert(false);
        }

        auto node_id = hash_trie_.get_root();

        while (!key.empty()) {
            auto [vptr, match] = label_store_.compare(node_id, key);
            if (vptr != nullptr) {
                return const_cast<value_type*>(vptr);
            }

            key.begin += match;

            while (lambda_ <= match) {
                if (hash_trie_.add_child(node_id, step_symb)) {
                    expand_if_needed_(node_id);
#ifdef POPLAR_EXTRA_STATS
                    ++num_steps_;
#endif
                    if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                        assert(node_id == label_store_.size());
                        label_store_.append_dummy();
                    }
                }
                match -= lambda_;
            }

            if (codes_[*key.begin] == UINT8_MAX) {
                // Update table
                codes_[*key.begin] = static_cast<uint8_t>(num_codes_++);
                POPLAR_THROW_IF(UINT8_MAX == num_codes_, "");
            }

            if (hash_trie_.add_child(node_id, make_symb_(*key.begin, match))) {
                expand_if_needed_(node_id);
                ++key.begin;
                ++size_;

                if constexpr (trie_type_id == trie_type_ids::FKHASH_TRIE) {
                    assert(node_id == label_store_.size());
                    return label_store_.append(key);
                }
                if constexpr (trie_type_id == trie_type_ids::BONSAI_TRIE) {
                    return label_store_.insert(node_id, key);
                }
                // should not come
                assert(false);
            }

            ++key.begin;
        }

        auto vptr = label_store_.compare(node_id, key).first;
        return vptr ? const_cast<value_type*>(vptr) : nullptr;
    }